

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O3

bool __thiscall
JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Contains
          (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this,
          EvalMapStringInternal<false> *value)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  EvalMapStringInternal<false> *this_00;
  
  if ((this->filled == false) && (this->writeIndex == 0)) {
    bVar1 = false;
  }
  else {
    this_00 = this->entries;
    uVar3 = 0;
    do {
      bVar1 = Js::EvalMapStringInternal<false>::operator==(this_00,value);
      if (bVar1) {
        return bVar1;
      }
      uVar3 = uVar3 + 1;
      uVar2 = (ulong)this->writeIndex;
      if (this->filled != false) {
        uVar2 = 0xf;
      }
      this_00 = this_00 + 1;
    } while (uVar3 < uVar2);
  }
  return bVar1;
}

Assistant:

bool Contains(const T& value)
        {
            for (uint i = 0; i < GetMaxIndex(); i++)
            {
                if (DefaultComparer<T>::Equals(entries[i], value))
                {
                    return true;
                }
            }

            return false;
        }